

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> * __thiscall
cfd::core::ByteData::SplitData
          (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__return_storage_ptr__
          ,ByteData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *split_size_list)

{
  bool bVar1;
  size_type sVar2;
  reference puVar3;
  undefined8 uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff28;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *pvVar5;
  CfdError error_code;
  const_reference local_a8;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [48];
  ByteData local_68;
  uint local_4c;
  const_iterator cStack_48;
  uint32_t size;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  uint local_28;
  uint32_t max;
  uint32_t offset;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *split_size_list_local;
  ByteData *this_local;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *result;
  
  pvVar5 = __return_storage_ptr__;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (__return_storage_ptr__);
  local_28 = 0;
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  __end2 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     (in_stack_ffffffffffffff28);
  cStack_48 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        (in_stack_ffffffffffffff28);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8);
    if (!bVar1) {
      return pvVar5;
    }
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    local_4c = *puVar3;
    if (local_4c == 0) {
      ByteData(&local_68);
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>(__return_storage_ptr__,&local_68);
      ~ByteData((ByteData *)0x3e5514);
    }
    else {
      if ((uint)sVar2 < local_28 + local_4c) {
        local_9a = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        error_code = (CfdError)((ulong)pvVar5 >> 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_98,"total size is maximum over.",&local_99);
        CfdException::CfdException((CfdException *)this,error_code,(string *)__return_storage_ptr__)
        ;
        local_9a = 0;
        __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_a8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
                            (ulong)local_28);
      ::std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
      emplace_back<unsigned_char_const*,unsigned_int&>
                ((vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)
                 __return_storage_ptr__,&local_a8,&local_4c);
      local_28 = local_4c + local_28;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

std::vector<ByteData> ByteData::SplitData(
    const std::vector<uint32_t>& split_size_list) const {
  std::vector<ByteData> result;
  uint32_t offset = 0;
  uint32_t max = static_cast<uint32_t>(data_.size());
  for (uint32_t size : split_size_list) {
    if (size == 0) {
      result.emplace_back(ByteData());
    } else if ((offset + size) > max) {
      throw CfdException(
          kCfdIllegalArgumentError, "total size is maximum over.");
    } else {
      result.emplace_back(&data_[offset], size);
      offset += size;
    }
  }
  return result;
}